

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O1

void __thiscall leveldb::MemEnvTest_DBTest_Test::TestBody(MemEnvTest_DBTest_Test *this)

{
  size_type sVar1;
  byte bVar2;
  int iVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer *__ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  char *pcVar7;
  char *in_R9;
  long lVar8;
  undefined1 auVar9 [16];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  DB *db;
  Slice vals [3];
  Slice keys [3];
  Options options;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  AssertHelper local_150;
  string local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  DB *local_108;
  AssertHelper local_100;
  char *local_f8;
  size_t local_f0;
  char *local_e8;
  undefined8 local_e0;
  char *local_d8;
  char local_d0 [8];
  char *local_c8;
  size_t local_c0;
  char *local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  Options local_90;
  undefined4 extraout_var;
  
  Options::Options(&local_90);
  local_90.create_if_missing = true;
  local_90.env = (this->super_MemEnvTest).env_;
  local_c8 = "aaa";
  local_c0 = 3;
  local_b8 = "bbb";
  local_b0 = 3;
  local_a8 = "ccc";
  local_a0 = 3;
  local_f8 = "foo";
  local_f0 = 3;
  local_e8 = "bar";
  local_e0 = 3;
  local_d8 = "baz";
  local_d0[0] = '\x03';
  local_d0[1] = '\0';
  local_d0[2] = '\0';
  local_d0[3] = '\0';
  local_d0[4] = '\0';
  local_d0[5] = '\0';
  local_d0[6] = '\0';
  local_d0[7] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"/dir/db","");
  DB::Open((DB *)&local_168,&local_90,&local_148,&local_108);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_128._M_local_buf,
             (char *)&local_150,(Status *)"DB::Open(options, \"/dir/db\", &db)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__((void *)local_168._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  uVar6 = local_128._8_8_;
  if (local_128._M_local_buf[0] == 0) {
    testing::Message::Message((Message *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_128._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,0xe1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    uVar6 = local_148._M_dataplus._M_p;
LAB_0010f8c1:
    uVar5 = local_128._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar6 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)uVar6 + 8))();
      uVar5 = local_128._8_8_;
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (*(long **)local_128._8_8_ != (long *)(local_128._8_8_ + 0x10)) {
        operator_delete(*(long **)local_128._8_8_);
      }
      operator_delete((void *)uVar6);
    }
    lVar8 = 0;
    do {
      local_150.data_._0_1_ = 0;
      (*local_108->_vptr_DB[2])
                (&local_128,local_108,&local_150,(long)&local_c8 + lVar8,(long)&local_f8 + lVar8);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_148,
                 local_168._M_local_buf,(Status *)"db->Put(WriteOptions(), keys[i], vals[i])");
      if ((void *)CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) !=
          (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_128._M_allocated_capacity._1_7_,
                                           local_128._M_local_buf[0]));
      }
      sVar1 = local_148._M_string_length;
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_string_length ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_148._M_string_length;
        }
        iVar3 = 0xe3;
        goto LAB_0010f8f1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (*(size_type **)local_148._M_string_length !=
            (size_type *)(local_148._M_string_length + 0x10)) {
          operator_delete(*(size_type **)local_148._M_string_length);
        }
        operator_delete((void *)sVar1);
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x30);
    lVar8 = 0;
    do {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      local_148._M_string_length = 0;
      local_148.field_2._M_local_buf[0] = '\0';
      local_168._M_allocated_capacity = 0x100;
      local_168._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      (*local_108->_vptr_DB[5])(&local_150,local_108,&local_168,(long)&local_c8 + lVar8,&local_148);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_128._M_local_buf
                 ,(char *)&local_100,(Status *)"db->Get(ReadOptions(), keys[i], &res)");
      if ((void *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_));
      }
      uVar6 = local_128._8_8_;
      if (local_128._M_local_buf[0] == 0) {
        testing::Message::Message((Message *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_128._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xe8,pcVar7);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        uVar6 = local_128._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(_func_int **)local_168._M_allocated_capacity + 8))();
          uVar6 = local_128._8_8_;
        }
LAB_0010fa59:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar6 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if (*(size_type **)uVar6 != (size_type *)(uVar6 + 0x10)) {
            operator_delete(*(size_type **)uVar6);
          }
          operator_delete((void *)uVar6);
        }
        goto LAB_0010fa77;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (*(long **)local_128._8_8_ != (long *)(local_128._8_8_ + 0x10)) {
          operator_delete(*(long **)local_128._8_8_);
        }
        operator_delete((void *)uVar6);
      }
      if ((long *)local_148._M_string_length != *(long **)(local_128._M_local_buf + lVar8 + 0x38)) {
        local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
LAB_0010f97c:
        local_168._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        testing::Message::Message((Message *)&local_150);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_128,(internal *)&local_168,(AssertionResult *)"res == vals[i]",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xe9,(char *)CONCAT71(local_128._M_allocated_capacity._1_7_,
                                          local_128._M_local_buf[0]));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) !=
            &local_118) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._M_allocated_capacity._1_7_,
                                      local_128._M_local_buf[0]));
        }
        uVar6 = local_168._8_8_;
        if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
          uVar6 = local_168._8_8_;
        }
        goto LAB_0010fa59;
      }
      iVar3 = bcmp(local_148._M_dataplus._M_p,*(void **)(local_128._M_local_buf + lVar8 + 0x30),
                   local_148._M_string_length);
      local_168._M_local_buf[0] = iVar3 == 0;
      local_168._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if (iVar3 != 0) goto LAB_0010f97c;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x30);
    local_148._M_dataplus._M_p = (pointer)0x100;
    local_148._M_string_length = 0;
    iVar3 = (*local_108->_vptr_DB[6])();
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    (**(code **)(*plVar4 + 0x18))(plVar4);
    lVar8 = 8;
    do {
      local_128._M_local_buf[0] = (**(code **)(*plVar4 + 0x10))(plVar4);
      local_128._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if (local_128._M_local_buf[0] == 0) {
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)local_128._M_local_buf,(AssertionResult *)0x158a41,"false"
                   ,"true",in_R9);
        iVar3 = 0xef;
        goto LAB_0010fb9c;
      }
      auVar9 = (**(code **)(*plVar4 + 0x40))(plVar4);
      if (*(size_t *)(local_128._M_local_buf + lVar8 + 0x60) != auVar9._8_8_) {
        local_128._M_local_buf[0] = false;
LAB_0010faf0:
        local_128._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)local_128._M_local_buf,
                   (AssertionResult *)"keys[i] == iterator->key()","false","true",in_R9);
        iVar3 = 0xf0;
        goto LAB_0010fb9c;
      }
      iVar3 = bcmp(*(void **)(local_128._M_local_buf + lVar8 + 0x58),auVar9._0_8_,
                   *(size_t *)(local_128._M_local_buf + lVar8 + 0x60));
      local_128._M_local_buf[0] = iVar3 == 0;
      local_128._8_8_ = 0;
      if (!(bool)local_128._M_local_buf[0]) goto LAB_0010faf0;
      auVar9 = (**(code **)(*plVar4 + 0x48))(plVar4);
      if (*(size_t *)(local_128._M_local_buf + lVar8 + 0x30) != auVar9._8_8_) {
        local_128._M_local_buf[0] = false;
LAB_0010fb4e:
        local_128._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)local_128._M_local_buf,
                   (AssertionResult *)"vals[i] == iterator->value()","false","true",in_R9);
        iVar3 = 0xf1;
        goto LAB_0010fb9c;
      }
      iVar3 = bcmp(*(void **)(local_128._M_local_buf + lVar8 + 0x28),auVar9._0_8_,
                   *(size_t *)(local_128._M_local_buf + lVar8 + 0x30));
      local_128._M_local_buf[0] = iVar3 == 0;
      local_128._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if (!(bool)local_128._M_local_buf[0]) goto LAB_0010fb4e;
      (**(code **)(*plVar4 + 0x30))(plVar4);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x38);
    bVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
    local_128._M_local_buf[0] = bVar2 ^ 1;
    local_128._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    if (local_128._M_local_buf[0] == 0) {
      testing::Message::Message((Message *)&local_168);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_148,(internal *)local_128._M_local_buf,
                 (AssertionResult *)"!iterator->Valid()","false","true",in_R9);
      iVar3 = 0xf4;
LAB_0010fb9c:
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,iVar3,local_148._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      uVar6 = local_168._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
        uVar6 = local_168._M_allocated_capacity;
      }
      goto LAB_0010f8c1;
    }
    (**(code **)(*plVar4 + 8))(plVar4);
    DBImpl::TEST_CompactMemTable((DBImpl *)&local_128);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_148,
               local_168._M_local_buf,(Status *)"dbi->TEST_CompactMemTable()");
    if ((void *)CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) !=
        (void *)0x0) {
      operator_delete__((void *)CONCAT71(local_128._M_allocated_capacity._1_7_,
                                         local_128._M_local_buf[0]));
    }
    sVar1 = local_148._M_string_length;
    if ((char)local_148._M_dataplus._M_p != '\0') {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (*(size_type **)local_148._M_string_length !=
            (size_type *)(local_148._M_string_length + 0x10)) {
          operator_delete(*(size_type **)local_148._M_string_length);
        }
        operator_delete((void *)sVar1);
      }
      lVar8 = 0;
      while( true ) {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        local_148._M_string_length = 0;
        local_148.field_2._M_local_buf[0] = '\0';
        local_168._M_allocated_capacity = 0x100;
        local_168._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        (*local_108->_vptr_DB[5])
                  (&local_150,local_108,&local_168,(long)&local_c8 + lVar8,&local_148);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)
                   local_128._M_local_buf,(char *)&local_100,
                   (Status *)"db->Get(ReadOptions(), keys[i], &res)");
        if ((void *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (void *)0x0) {
          operator_delete__((void *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_));
        }
        uVar6 = local_128._8_8_;
        if (local_128._M_local_buf[0] == 0) break;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if (*(long **)local_128._8_8_ != (long *)(local_128._8_8_ + 0x10)) {
            operator_delete(*(long **)local_128._8_8_);
          }
          operator_delete((void *)uVar6);
        }
        if ((long *)local_148._M_string_length != *(long **)(local_128._M_local_buf + lVar8 + 0x38))
        {
          local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
LAB_0010fdbc:
          local_168._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          testing::Message::Message((Message *)&local_150);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_128,(internal *)&local_168,(AssertionResult *)"res == vals[i]"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                     ,0xfd,(char *)CONCAT71(local_128._M_allocated_capacity._1_7_,
                                            local_128._M_local_buf[0]));
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_150);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) !=
              &local_118) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_128._M_allocated_capacity._1_7_,
                                        local_128._M_local_buf[0]));
          }
          this_00 = &local_168;
          if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
            this_00 = &local_168;
          }
          goto LAB_0010fe97;
        }
        iVar3 = bcmp(local_148._M_dataplus._M_p,*(void **)(local_128._M_local_buf + lVar8 + 0x30),
                     local_148._M_string_length);
        local_168._M_local_buf[0] = iVar3 == 0;
        local_168._8_8_ = 0;
        if (iVar3 != 0) goto LAB_0010fdbc;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        lVar8 = lVar8 + 0x10;
        if (lVar8 == 0x30) {
          if (local_108 != (DB *)0x0) {
            (*local_108->_vptr_DB[1])();
            return;
          }
          return;
        }
      }
      testing::Message::Message((Message *)&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_128._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,0xfc,pcVar7);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(_func_int **)local_168._M_allocated_capacity + 8))();
      }
      this_00 = &local_128;
LAB_0010fe97:
      testing::AssertionResult::~AssertionResult((AssertionResult *)this_00);
LAB_0010fa77:
      uVar5 = local_148._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p == &local_148.field_2) {
        return;
      }
      goto LAB_0010f93a;
    }
    testing::Message::Message((Message *)&local_128._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_148._M_string_length;
    }
    iVar3 = 0xf8;
LAB_0010f8f1:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,iVar3,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_168,(Message *)&local_128._M_allocated_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    uVar5 = local_148._M_string_length;
    if ((long *)CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]
                                    ) + 8))();
      uVar5 = local_148._M_string_length;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return;
  }
  if (*(size_type **)uVar5 != (size_type *)(uVar5 + 0x10)) {
    operator_delete(*(size_type **)uVar5);
  }
LAB_0010f93a:
  operator_delete((void *)uVar5);
  return;
}

Assistant:

TEST_F(MemEnvTest, DBTest) {
  Options options;
  options.create_if_missing = true;
  options.env = env_;
  DB* db;

  const Slice keys[] = {Slice("aaa"), Slice("bbb"), Slice("ccc")};
  const Slice vals[] = {Slice("foo"), Slice("bar"), Slice("baz")};

  ASSERT_LEVELDB_OK(DB::Open(options, "/dir/db", &db));
  for (size_t i = 0; i < 3; ++i) {
    ASSERT_LEVELDB_OK(db->Put(WriteOptions(), keys[i], vals[i]));
  }

  for (size_t i = 0; i < 3; ++i) {
    std::string res;
    ASSERT_LEVELDB_OK(db->Get(ReadOptions(), keys[i], &res));
    ASSERT_TRUE(res == vals[i]);
  }

  Iterator* iterator = db->NewIterator(ReadOptions());
  iterator->SeekToFirst();
  for (size_t i = 0; i < 3; ++i) {
    ASSERT_TRUE(iterator->Valid());
    ASSERT_TRUE(keys[i] == iterator->key());
    ASSERT_TRUE(vals[i] == iterator->value());
    iterator->Next();
  }
  ASSERT_TRUE(!iterator->Valid());
  delete iterator;

  DBImpl* dbi = reinterpret_cast<DBImpl*>(db);
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  for (size_t i = 0; i < 3; ++i) {
    std::string res;
    ASSERT_LEVELDB_OK(db->Get(ReadOptions(), keys[i], &res));
    ASSERT_TRUE(res == vals[i]);
  }

  delete db;
}